

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testOptimizedInterleavePatterns.cpp
# Opt level: O0

void testOptimizedInterleavePatterns(string *tempDir)

{
  ostream *poVar1;
  char *unaff_retaddr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000008;
  bool in_stack_000000b6;
  bool in_stack_000000b7;
  string asStack_28 [40];
  
  std::operator+(in_stack_00000008,unaff_retaddr);
  std::__cxx11::string::operator=((string *)(anonymous_namespace)::filename_abi_cxx11_,asStack_28);
  std::__cxx11::string::~string(asStack_28);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "Testing SSE optimisation with different interleave patterns (large images) ... "
                          );
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  anon_unknown.dwarf_1e4dfb::runtests(in_stack_000000b7,in_stack_000000b6);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "Testing SSE optimisation with different interleave patterns (tiny images) ... "
                          );
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  anon_unknown.dwarf_1e4dfb::runtests(in_stack_000000b7,in_stack_000000b6);
  poVar1 = std::operator<<((ostream *)&std::cout,"ok\n");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void
testOptimizedInterleavePatterns (const std::string& tempDir)
{
    filename = tempDir + "imf_test_interleave_patterns.exr";

    cout
        << "Testing SSE optimisation with different interleave patterns (large images) ... "
        << endl;
    runtests (false, false);

    cout
        << "Testing SSE optimisation with different interleave patterns (tiny images) ... "
        << endl;
    runtests (false, true);

    cout << "ok\n" << endl;
}